

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O1

value scope_metadata(scope sp)

{
  char *__s;
  bool bVar1;
  value v;
  value *ppvVar2;
  value pvVar3;
  value *ppvVar4;
  value pvVar5;
  size_t length;
  value pvVar6;
  value pvVar7;
  value pvVar8;
  value *local_68;
  value *ppvStack_60;
  value *local_58;
  size_t sStack_50;
  size_t local_48;
  size_t sStack_40;
  
  v = value_create_map((value *)0x0,4);
  if (v == (value)0x0) {
    return (value)0x0;
  }
  ppvVar2 = value_to_map(v);
  pvVar3 = value_create_array((value *)0x0,2);
  pvVar5 = (value)0x0;
  if (pvVar3 != (value)0x0) {
    ppvVar4 = value_to_array(pvVar3);
    pvVar5 = value_create_string("name",4);
    *ppvVar4 = pvVar5;
    if (pvVar5 == (value)0x0) {
      value_type_destroy(pvVar3);
    }
    __s = sp->name;
    length = strlen(__s);
    pvVar6 = value_create_string(__s,length);
    ppvVar4[1] = pvVar6;
    pvVar5 = pvVar3;
    if (pvVar6 == (value)0x0) {
      value_type_destroy(pvVar3);
    }
  }
  *ppvVar2 = pvVar5;
  if (pvVar5 == (value)0x0) goto LAB_00109714;
  local_48 = 0;
  sStack_40 = 0;
  local_58 = (value *)0x0;
  sStack_50 = 0;
  local_68 = (value *)0x0;
  ppvStack_60 = (value *)0x0;
  set_iterate(sp->objects,scope_metadata_array_cb_iterate_counter,&local_68);
  pvVar5 = value_create_array((value *)0x0,sStack_50);
  if (pvVar5 == (value)0x0) {
LAB_00109654:
    pvVar5 = (value)0x0;
    pvVar3 = (value)0x0;
    pvVar6 = (value)0x0;
    bVar1 = false;
  }
  else {
    local_68 = value_to_array(pvVar5);
    pvVar3 = value_create_array((value *)0x0,local_48);
    if (pvVar3 == (value)0x0) {
LAB_0010964c:
      value_destroy(pvVar5);
      goto LAB_00109654;
    }
    ppvStack_60 = value_to_array(pvVar3);
    pvVar6 = value_create_array((value *)0x0,sStack_40);
    if (pvVar6 == (value)0x0) {
      value_destroy(pvVar5);
      pvVar5 = pvVar3;
      goto LAB_0010964c;
    }
    local_58 = value_to_array(pvVar6);
    sStack_50 = 0;
    local_48 = 0;
    sStack_40 = 0;
    set_iterate(sp->objects,scope_metadata_array_cb_iterate,&local_68);
    bVar1 = true;
  }
  if (bVar1) {
    pvVar7 = value_create_array((value *)0x0,2);
    ppvVar4 = value_to_array(pvVar7);
    pvVar8 = value_create_string("funcs",5);
    *ppvVar4 = pvVar8;
    ppvVar4[1] = pvVar5;
    ppvVar2[1] = pvVar7;
    pvVar5 = value_create_array((value *)0x0,2);
    ppvVar4 = value_to_array(pvVar5);
    pvVar7 = value_create_string("classes",7);
    *ppvVar4 = pvVar7;
    ppvVar4[1] = pvVar3;
    ppvVar2[2] = pvVar5;
    pvVar5 = value_create_array((value *)0x0,2);
    ppvVar4 = value_to_array(pvVar5);
    pvVar3 = value_create_string("objects",7);
    *ppvVar4 = pvVar3;
    ppvVar4[1] = pvVar6;
    ppvVar2[3] = pvVar5;
    return v;
  }
LAB_00109714:
  value_type_destroy(v);
  return (value)0x0;
}

Assistant:

value scope_metadata(scope sp)
{
	value *v_map, v = value_create_map(NULL, 4);
	value v_array[3] = { NULL, NULL, NULL }; // 0: funcs, 1: cls, 2: obj

	if (v == NULL)
	{
		return NULL;
	}

	v_map = value_to_map(v);

	v_map[0] = scope_metadata_name(sp);

	if (v_map[0] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	/* Obtain all scope objects of each type (functions, classes and objects) */
	if (scope_metadata_array(sp, v_array) != 0)
	{
		value_type_destroy(v);
		return NULL;
	}

	/* Functions */
	static const char funcs[] = "funcs";
	value *v_funcs_ptr, v_funcs = value_create_array(NULL, 2);
	v_funcs_ptr = value_to_array(v_funcs);
	v_funcs_ptr[0] = value_create_string(funcs, sizeof(funcs) - 1);
	v_funcs_ptr[1] = v_array[0];
	v_map[1] = v_funcs;

	/* Classes */
	static const char classes[] = "classes";
	value *v_classes_ptr, v_classes = value_create_array(NULL, 2);
	v_classes_ptr = value_to_array(v_classes);
	v_classes_ptr[0] = value_create_string(classes, sizeof(classes) - 1);
	v_classes_ptr[1] = v_array[1];
	v_map[2] = v_classes;

	/* Objects */
	static const char objects[] = "objects";
	value *v_objects_ptr, v_objects = value_create_array(NULL, 2);
	v_objects_ptr = value_to_array(v_objects);
	v_objects_ptr[0] = value_create_string(objects, sizeof(objects) - 1);
	v_objects_ptr[1] = v_array[2];
	v_map[3] = v_objects;

	return v;
}